

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O1

uint8_t * __thiscall
edition_unittest::Int32ParseTester::_InternalSerialize
          (Int32ParseTester *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  RepeatedField<int> *this_00;
  bool bVar1;
  uintptr_t *puVar2;
  int iVar3;
  LongSooRep *pLVar4;
  int *piVar5;
  uint8_t *puVar6;
  byte *extraout_RAX;
  byte *extraout_RAX_00;
  byte *extraout_RAX_01;
  byte *extraout_RAX_02;
  byte *extraout_RAX_03;
  byte *pbVar7;
  byte *extraout_RAX_04;
  LongSooRep *in_RCX;
  LongSooRep *pLVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  int *piVar13;
  LongSooRep *unaff_R13;
  byte *pbVar14;
  LongSooRep local_40;
  
  uVar12 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar12 & 1) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                       (stream,(this->field_0)._impl_.optional_int32_lowfield_,target);
  }
  uVar11 = *(uint *)((long)&this->field_0 + 0x30);
  pLVar4 = (LongSooRep *)(ulong)uVar11;
  if ((int)uVar11 < 1) {
LAB_00c74f8f:
    uVar11 = *(uint *)((long)&this->field_0 + 0x48);
    pLVar4 = (LongSooRep *)(ulong)uVar11;
    if ((int)uVar11 < 1) goto LAB_00c75055;
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    if (stream->end_ <= target) {
      _InternalSerialize();
      pbVar7 = extraout_RAX_00;
      goto LAB_00c75550;
    }
    unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.packed_int32_lowfield_;
    *target = 0x1a;
    pbVar7 = target + 1;
    if (0x7f < uVar11) goto LAB_00c75511;
  }
  else {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    if (target < stream->end_) {
      this_00 = &(this->field_0)._impl_.repeated_int32_lowfield_;
      *target = 0x12;
      pbVar7 = target + 1;
      if (0x7f < uVar11) {
        do {
          target = pbVar7;
          uVar11 = (uint)pLVar4;
          *target = (byte)pLVar4 | 0x80;
          pLVar4 = (LongSooRep *)((ulong)pLVar4 >> 7);
          pbVar7 = target + 1;
        } while (0x3fff < uVar11);
      }
      *pbVar7 = (byte)pLVar4;
      if ((undefined1  [16])((undefined1  [16])(this_00->soo_rep_).field_0 & (undefined1  [16])0x4)
          == (undefined1  [16])0x0) {
        pLVar4 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.repeated_int32_lowfield_.soo_rep_.field_0 + 8);
      }
      else {
        pLVar4 = (LongSooRep *)
                 google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_00);
      }
      target = target + 2;
      iVar3 = google::protobuf::internal::SooRep::size
                        (&this_00->soo_rep_,
                         (undefined1  [16])
                         ((undefined1  [16])(this_00->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                         (undefined1  [16])0x0);
      unaff_R13 = (LongSooRep *)((long)&pLVar4->elements_int + (long)iVar3 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (LongSooRep *)(long)(int)pLVar4->elements_int;
        pLVar8 = in_RCX;
        if ((LongSooRep *)0x7f < in_RCX) {
          do {
            *target = (byte)pLVar8 | 0x80;
            in_RCX = (LongSooRep *)((ulong)pLVar8 >> 7);
            target = target + 1;
            bVar1 = (LongSooRep *)0x3fff < pLVar8;
            pLVar8 = in_RCX;
          } while (bVar1);
        }
        pLVar4 = (LongSooRep *)((long)&pLVar4->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar4 < unaff_R13);
      goto LAB_00c74f8f;
    }
    _InternalSerialize();
    pbVar7 = extraout_RAX;
LAB_00c75511:
    do {
      target = pbVar7;
      uVar11 = (uint)pLVar4;
      *target = (byte)pLVar4 | 0x80;
      pLVar4 = (LongSooRep *)((ulong)pLVar4 >> 7);
      pbVar7 = target + 1;
    } while (0x3fff < uVar11);
  }
  *pbVar7 = (byte)pLVar4;
  if ((unaff_R13->elements_int & 4) == 0) {
    pLVar4 = (LongSooRep *)
             ((long)&(this->field_0)._impl_.packed_int32_lowfield_.soo_rep_.field_0 + 8);
  }
  else {
    pLVar4 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
  }
  target = target + 2;
  iVar3 = google::protobuf::internal::SooRep::size
                    ((SooRep *)unaff_R13,(unaff_R13->elements_int & 4) == 0);
  unaff_R13 = (LongSooRep *)((long)&pLVar4->elements_int + (long)iVar3 * 4);
  do {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    in_RCX = (LongSooRep *)(long)(int)pLVar4->elements_int;
    pLVar8 = in_RCX;
    if ((LongSooRep *)0x7f < in_RCX) {
      do {
        *target = (byte)pLVar8 | 0x80;
        in_RCX = (LongSooRep *)((ulong)pLVar8 >> 7);
        target = target + 1;
        bVar1 = (LongSooRep *)0x3fff < pLVar8;
        pLVar8 = in_RCX;
      } while (bVar1);
    }
    pLVar4 = (LongSooRep *)((long)&pLVar4->elements_int + 4);
    *target = (byte)in_RCX;
    target = target + 1;
  } while (pLVar4 < unaff_R13);
LAB_00c75055:
  if ((uVar12 & 4) == 0) goto LAB_00c7508d;
  if (stream->end_ <= target) {
    target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
  }
  in_RCX = (LongSooRep *)(long)(this->field_0)._impl_.other_field_;
  pbVar7 = target + 2;
  target[0] = 0x98;
  target[1] = 6;
  pLVar4 = in_RCX;
  if ((LongSooRep *)0x7f < in_RCX) goto LAB_00c7564b;
  do {
    *pbVar7 = (byte)in_RCX;
    target = pbVar7 + 1;
LAB_00c7508d:
    if ((uVar12 & 2) != 0) {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      in_RCX = (LongSooRep *)(long)(this->field_0)._impl_.optional_int32_midfield_;
      pbVar7 = target + 2;
      target[0] = 200;
      target[1] = 0x3e;
      pLVar4 = in_RCX;
      if ((LongSooRep *)0x7f < in_RCX) {
        do {
          *pbVar7 = (byte)pLVar4 | 0x80;
          in_RCX = (LongSooRep *)((ulong)pLVar4 >> 7);
          pbVar7 = pbVar7 + 1;
          bVar1 = (LongSooRep *)0x3fff < pLVar4;
          pLVar4 = in_RCX;
        } while (bVar1);
      }
      *pbVar7 = (byte)in_RCX;
      target = pbVar7 + 1;
    }
    uVar11 = *(uint *)((long)&this->field_0 + 0x60);
    pLVar4 = (LongSooRep *)(ulong)uVar11;
    if ((int)uVar11 < 1) {
LAB_00c75190:
      uVar11 = *(uint *)((long)&this->field_0 + 0x78);
      pLVar4 = (LongSooRep *)(ulong)uVar11;
      if ((int)uVar11 < 1) goto LAB_00c75261;
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      if (target < stream->end_) {
        unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.packed_int32_midfield_;
        target[0] = 0xda;
        target[1] = 0x3e;
        pbVar7 = target + 2;
        if (0x7f < uVar11) goto LAB_00c7558f;
        pbVar14 = target + 1;
        goto LAB_00c751d0;
      }
      _InternalSerialize();
      pbVar7 = extraout_RAX_02;
LAB_00c755ce:
      do {
        target = pbVar7;
        *target = (byte)uVar12 | 0x80;
        uVar11 = uVar12 >> 7;
        pbVar7 = target + 1;
        bVar1 = 0x3fff < uVar12;
        uVar12 = uVar11;
      } while (bVar1);
LAB_00c752c8:
      *pbVar7 = (byte)uVar11;
      if ((pLVar4->elements_int & 4) == 0) {
        unaff_R13 = (LongSooRep *)
                    ((long)&(this->field_0)._impl_.repeated_int32_hifield_.soo_rep_.field_0 + 8);
      }
      else {
        unaff_R13 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(pLVar4);
      }
      target = target + 2;
      iVar3 = google::protobuf::internal::SooRep::size
                        ((SooRep *)pLVar4,(pLVar4->elements_int & 4) == 0);
      puVar2 = &unaff_R13->elements_int;
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (LongSooRep *)(long)(int)unaff_R13->elements_int;
        pLVar4 = in_RCX;
        if ((LongSooRep *)0x7f < in_RCX) {
          do {
            *target = (byte)pLVar4 | 0x80;
            in_RCX = (LongSooRep *)((ulong)pLVar4 >> 7);
            target = target + 1;
            bVar1 = (LongSooRep *)0x3fff < pLVar4;
            pLVar4 = in_RCX;
          } while (bVar1);
        }
        unaff_R13 = (LongSooRep *)((long)&unaff_R13->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (unaff_R13 < (LongSooRep *)((long)puVar2 + (long)iVar3 * 4));
    }
    else {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      if (target < stream->end_) {
        unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.repeated_int32_midfield_;
        target[0] = 0xd2;
        target[1] = 0x3e;
        pbVar7 = target + 2;
        if (uVar11 < 0x80) {
          pbVar14 = target + 1;
        }
        else {
LAB_00c75550:
          do {
            pbVar14 = pbVar7;
            uVar11 = (uint)pLVar4;
            *pbVar14 = (byte)pLVar4 | 0x80;
            pLVar4 = (LongSooRep *)((ulong)pLVar4 >> 7);
            pbVar7 = pbVar14 + 1;
          } while (0x3fff < uVar11);
        }
        *pbVar7 = (byte)pLVar4;
        if ((unaff_R13->elements_int & 4) == 0) {
          pLVar4 = (LongSooRep *)
                   ((long)&(this->field_0)._impl_.repeated_int32_midfield_.soo_rep_.field_0 + 8);
        }
        else {
          pLVar4 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
        }
        target = pbVar14 + 2;
        iVar3 = google::protobuf::internal::SooRep::size
                          ((SooRep *)unaff_R13,(unaff_R13->elements_int & 4) == 0);
        unaff_R13 = (LongSooRep *)((long)&pLVar4->elements_int + (long)iVar3 * 4);
        do {
          if (stream->end_ <= target) {
            target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
          }
          in_RCX = (LongSooRep *)(long)(int)pLVar4->elements_int;
          pLVar8 = in_RCX;
          if ((LongSooRep *)0x7f < in_RCX) {
            do {
              *target = (byte)pLVar8 | 0x80;
              in_RCX = (LongSooRep *)((ulong)pLVar8 >> 7);
              target = target + 1;
              bVar1 = (LongSooRep *)0x3fff < pLVar8;
              pLVar8 = in_RCX;
            } while (bVar1);
          }
          pLVar4 = (LongSooRep *)((long)&pLVar4->elements_int + 4);
          *target = (byte)in_RCX;
          target = target + 1;
        } while (pLVar4 < unaff_R13);
        goto LAB_00c75190;
      }
      _InternalSerialize();
      pbVar7 = extraout_RAX_01;
LAB_00c7558f:
      do {
        pbVar14 = pbVar7;
        uVar11 = (uint)pLVar4;
        *pbVar14 = (byte)pLVar4 | 0x80;
        pLVar4 = (LongSooRep *)((ulong)pLVar4 >> 7);
        pbVar7 = pbVar14 + 1;
      } while (0x3fff < uVar11);
LAB_00c751d0:
      *pbVar7 = (byte)pLVar4;
      if ((unaff_R13->elements_int & 4) == 0) {
        pLVar4 = (LongSooRep *)
                 ((long)&(this->field_0)._impl_.packed_int32_midfield_.soo_rep_.field_0 + 8);
      }
      else {
        pLVar4 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
      }
      target = pbVar14 + 2;
      iVar3 = google::protobuf::internal::SooRep::size
                        ((SooRep *)unaff_R13,(unaff_R13->elements_int & 4) == 0);
      unaff_R13 = (LongSooRep *)((long)&pLVar4->elements_int + (long)iVar3 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        in_RCX = (LongSooRep *)(long)(int)pLVar4->elements_int;
        pLVar8 = in_RCX;
        if ((LongSooRep *)0x7f < in_RCX) {
          do {
            *target = (byte)pLVar8 | 0x80;
            in_RCX = (LongSooRep *)((ulong)pLVar8 >> 7);
            target = target + 1;
            bVar1 = (LongSooRep *)0x3fff < pLVar8;
            pLVar8 = in_RCX;
          } while (bVar1);
        }
        pLVar4 = (LongSooRep *)((long)&pLVar4->elements_int + 4);
        *target = (byte)in_RCX;
        target = target + 1;
      } while (pLVar4 < unaff_R13);
LAB_00c75261:
      if ((uVar12 & 8) != 0) {
        pLVar4 = &local_40;
        in_RCX = pLVar4;
        _InternalSerialize();
        target = (uint8_t *)local_40.elements_int;
      }
      uVar11 = *(uint *)((long)&this->field_0 + 0x90);
      if (0 < (int)uVar11) {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        if (target < stream->end_) {
          pLVar4 = (LongSooRep *)&(this->field_0)._impl_.repeated_int32_hifield_;
          uVar12 = 0x7a1212;
          do {
            pbVar7 = target;
            *pbVar7 = (byte)uVar12 | 0x80;
            target = pbVar7 + 1;
            bVar1 = 0x3fff < uVar12;
            uVar12 = uVar12 >> 7;
          } while (bVar1);
          *target = 3;
          pbVar7 = pbVar7 + 2;
          uVar12 = uVar11;
          if (0x7f < uVar11) goto LAB_00c755ce;
          goto LAB_00c752c8;
        }
        _InternalSerialize();
        pbVar7 = extraout_RAX_03;
        goto LAB_00c7560b;
      }
    }
    uVar12 = *(uint *)((long)&this->field_0 + 0xa8);
    if ((int)uVar12 < 1) goto LAB_00c75455;
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    if (target < stream->end_) {
      pLVar4 = (LongSooRep *)&(this->field_0)._impl_.packed_int32_hifield_;
      uVar11 = 0x7a121a;
      do {
        pbVar7 = target;
        *pbVar7 = (byte)uVar11 | 0x80;
        target = pbVar7 + 1;
        bVar1 = 0x3fff < uVar11;
        uVar11 = uVar11 >> 7;
      } while (bVar1);
      *target = 3;
      pbVar7 = pbVar7 + 2;
      uVar11 = uVar12;
      if (0x7f < uVar12) {
LAB_00c7560b:
        do {
          target = pbVar7;
          *target = (byte)uVar11 | 0x80;
          uVar12 = uVar11 >> 7;
          pbVar7 = target + 1;
          bVar1 = 0x3fff < uVar11;
          uVar11 = uVar12;
        } while (bVar1);
      }
      *pbVar7 = (byte)uVar12;
      if ((pLVar4->elements_int & 4) == 0) {
        piVar5 = (int *)((long)&this->field_0 + 0xa0);
      }
      else {
        piVar5 = (int *)google::protobuf::internal::LongSooRep::elements(pLVar4);
      }
      target = target + 2;
      iVar3 = google::protobuf::internal::SooRep::size
                        ((SooRep *)pLVar4,(pLVar4->elements_int & 4) == 0);
      piVar13 = piVar5 + iVar3;
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        uVar9 = (ulong)*piVar5;
        uVar10 = uVar9;
        if (0x7f < uVar9) {
          do {
            *target = (byte)uVar10 | 0x80;
            uVar9 = uVar10 >> 7;
            target = target + 1;
            bVar1 = 0x3fff < uVar10;
            uVar10 = uVar9;
          } while (bVar1);
        }
        piVar5 = piVar5 + 1;
        *target = (byte)uVar9;
        target = target + 1;
      } while (piVar5 < piVar13);
LAB_00c75455:
      if (*(short *)((long)&this->field_0 + 10) != 0) {
        target = google::protobuf::internal::ExtensionSet::_InternalSerializeAllImpl
                           (&(this->field_0)._impl_._extensions_,
                            (MessageLite *)_Int32ParseTester_default_instance_,target,stream);
      }
      uVar10 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if ((uVar10 & 1) != 0) {
        puVar6 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                           ((UnknownFieldSet *)((uVar10 & 0xfffffffffffffffe) + 8),target,stream);
        return puVar6;
      }
      return target;
    }
    _InternalSerialize();
    pbVar7 = extraout_RAX_04;
    pLVar4 = in_RCX;
LAB_00c7564b:
    do {
      *pbVar7 = (byte)pLVar4 | 0x80;
      in_RCX = (LongSooRep *)((ulong)pLVar4 >> 7);
      pbVar7 = pbVar7 + 1;
      bVar1 = (LongSooRep *)0x3fff < pLVar4;
      pLVar4 = in_RCX;
    } while (bVar1);
  } while( true );
}

Assistant:

::uint8_t* PROTOBUF_NONNULL Int32ParseTester::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const Int32ParseTester& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.Int32ParseTester)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // int32 optional_int32_lowfield = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
            stream, this_._internal_optional_int32_lowfield(), target);
  }

  // repeated int32 repeated_int32_lowfield = 2;
  {
    int byte_size = this_._impl_._repeated_int32_lowfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          2, this_._internal_repeated_int32_lowfield(), byte_size, target);
    }
  }

  // repeated int32 packed_int32_lowfield = 3 [features = {
  {
    int byte_size = this_._impl_._packed_int32_lowfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          3, this_._internal_packed_int32_lowfield(), byte_size, target);
    }
  }

  // int32 other_field = 99;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        99, this_._internal_other_field(), target);
  }

  // int32 optional_int32_midfield = 1001;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        1001, this_._internal_optional_int32_midfield(), target);
  }

  // repeated int32 repeated_int32_midfield = 1002;
  {
    int byte_size = this_._impl_._repeated_int32_midfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          1002, this_._internal_repeated_int32_midfield(), byte_size, target);
    }
  }

  // repeated int32 packed_int32_midfield = 1003 [features = {
  {
    int byte_size = this_._impl_._packed_int32_midfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          1003, this_._internal_packed_int32_midfield(), byte_size, target);
    }
  }

  // int32 optional_int32_hifield = 1000001;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        1000001, this_._internal_optional_int32_hifield(), target);
  }

  // repeated int32 repeated_int32_hifield = 1000002;
  {
    int byte_size = this_._impl_._repeated_int32_hifield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          1000002, this_._internal_repeated_int32_hifield(), byte_size, target);
    }
  }

  // repeated int32 packed_int32_hifield = 1000003 [features = {
  {
    int byte_size = this_._impl_._packed_int32_hifield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          1000003, this_._internal_packed_int32_hifield(), byte_size, target);
    }
  }

  // All extensions.
  target = this_._impl_._extensions_._InternalSerializeAll(&default_instance(),
                                                    target, stream);
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.Int32ParseTester)
  return target;
}